

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_triangle_from_direction
               (nk_vec2 *result,nk_rect r,float pad_x,float pad_y,nk_heading direction)

{
  float x;
  float y;
  nk_vec2 nVar1;
  float local_9c;
  float local_98;
  float h_half;
  float w_half;
  nk_heading direction_local;
  float pad_y_local;
  float pad_x_local;
  nk_vec2 *result_local;
  nk_rect r_local;
  
  if (result == (nk_vec2 *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x183d,
                  "void nk_triangle_from_direction(struct nk_vec2 *, struct nk_rect, float, float, enum nk_heading)"
                 );
  }
  r_local.x = r.w;
  if (r_local.x <= pad_x * 2.0) {
    local_98 = pad_x * 2.0;
  }
  else {
    local_98 = r_local.x;
  }
  r_local.y = r.h;
  if (r_local.y <= pad_y * 2.0) {
    local_9c = pad_y * 2.0;
  }
  else {
    local_9c = r_local.y;
  }
  local_98 = local_98 - (pad_x + pad_x);
  local_9c = local_9c - (pad_y + pad_y);
  result_local._0_4_ = r.x;
  x = result_local._0_4_ + pad_x;
  result_local._4_4_ = r.y;
  y = result_local._4_4_ + pad_y;
  if (direction == NK_UP) {
    nVar1 = nk_vec2(x + local_98 / 2.0,y);
    *result = nVar1;
    nVar1 = nk_vec2(x + local_98,y + local_9c);
    result[1] = nVar1;
    nVar1 = nk_vec2(x,y + local_9c);
    result[2] = nVar1;
  }
  else if (direction == NK_RIGHT) {
    nVar1 = nk_vec2(x,y);
    *result = nVar1;
    nVar1 = nk_vec2(x + local_98,y + local_9c / 2.0);
    result[1] = nVar1;
    nVar1 = nk_vec2(x,y + local_9c);
    result[2] = nVar1;
  }
  else if (direction == NK_DOWN) {
    nVar1 = nk_vec2(x,y);
    *result = nVar1;
    nVar1 = nk_vec2(x + local_98,y);
    result[1] = nVar1;
    nVar1 = nk_vec2(x + local_98 / 2.0,y + local_9c);
    result[2] = nVar1;
  }
  else {
    nVar1 = nk_vec2(x,y + local_9c / 2.0);
    *result = nVar1;
    nVar1 = nk_vec2(x + local_98,y);
    result[1] = nVar1;
    nVar1 = nk_vec2(x + local_98,y + local_9c);
    result[2] = nVar1;
  }
  return;
}

Assistant:

NK_API void
nk_triangle_from_direction(struct nk_vec2 *result, struct nk_rect r,
    float pad_x, float pad_y, enum nk_heading direction)
{
    float w_half, h_half;
    NK_ASSERT(result);

    r.w = NK_MAX(2 * pad_x, r.w);
    r.h = NK_MAX(2 * pad_y, r.h);
    r.w = r.w - 2 * pad_x;
    r.h = r.h - 2 * pad_y;

    r.x = r.x + pad_x;
    r.y = r.y + pad_y;

    w_half = r.w / 2.0f;
    h_half = r.h / 2.0f;

    if (direction == NK_UP) {
        result[0] = nk_vec2(r.x + w_half, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + r.h);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_RIGHT) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y + h_half);
        result[2] = nk_vec2(r.x, r.y + r.h);
    } else if (direction == NK_DOWN) {
        result[0] = nk_vec2(r.x, r.y);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + w_half, r.y + r.h);
    } else {
        result[0] = nk_vec2(r.x, r.y + h_half);
        result[1] = nk_vec2(r.x + r.w, r.y);
        result[2] = nk_vec2(r.x + r.w, r.y + r.h);
    }
}